

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void skiwi::anon_unknown_4::print_ptr
               (uint64_t rax2,ostream *out,
               shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env,repl_data *rd,
               context *p_ctxt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  pointer pcVar3;
  long lVar4;
  pointer pbVar5;
  pointer ptVar6;
  char cVar7;
  ostream *poVar8;
  long *plVar9;
  uint uVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer pbVar12;
  uint64_t item;
  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  todo;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  texts;
  uint64_t first;
  string txt;
  uint64_t second;
  stringstream str;
  char local_2b8;
  undefined7 uStackY_2b7;
  size_type local_2b0;
  undefined8 local_2a8;
  undefined8 in_stack_fffffffffffffd60;
  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  ulong local_250;
  context *local_248;
  pointer local_240;
  pointer local_238;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> *local_230;
  repl_data *local_228;
  value_type local_218;
  ostream *local_1f8;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_1f0;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_1e0;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> local_1d0;
  stringstream local_1b8 [16];
  long local_1a8;
  long local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.
  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248 = p_ctxt;
  local_230 = env;
  local_228 = rd;
  local_1f8 = out;
  local_288.
  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  ._M_impl.super__Vector_impl_data._M_start =
       std::
       _Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
       ::_M_allocate((_Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                      *)0x1,(size_t)out);
  ((local_288.
    super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
    ._M_impl.super__Vector_impl_data._M_start)->txt)._M_dataplus._M_p =
       (pointer)&((local_288.
                   super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                   ._M_impl.super__Vector_impl_data._M_start)->txt).field_2;
  ((local_288.
    super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
    ._M_impl.super__Vector_impl_data._M_start)->txt)._M_string_length = 0;
  ((local_288.
    super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
    ._M_impl.super__Vector_impl_data._M_start)->txt).field_2._M_local_buf[0] = '\0';
  (local_288.
   super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
   ._M_impl.super__Vector_impl_data._M_start)->rax = rax2;
  (local_288.
   super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
   ._M_impl.super__Vector_impl_data._M_start)->second_item_of_pair = 0;
  local_288.
  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_288.
       super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  local_288.
  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_288.
       super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  pbVar12 = local_268.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = local_268.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_288.
      super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_288.
      super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ptVar6 = local_288.
               super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_240 = local_288.
                  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = local_288.
               super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].rax;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      pcVar3 = local_288.
               super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].txt._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar3,
                 pcVar3 + local_288.
                          super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].txt._M_string_length);
      local_288.
      super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
      ._M_impl.super__Vector_impl_data._M_finish = ptVar6 + -1;
      pcVar3 = ptVar6[-1].txt._M_dataplus._M_p;
      paVar1 = &ptVar6[-1].txt.field_2;
      local_238 = local_288.
                  super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      *(long *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) =
           (long)*(int *)(local_1f8 + *(long *)(*(long *)local_1f8 + -0x18) + 8);
      if (local_218._M_string_length == 0) {
        if ((uVar11 & 1) == 0) {
          std::ostream::_M_insert<long>((long)&local_1a8);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2b8);
        }
        else {
          uVar10 = (uint)uVar11 & 7;
          if (uVar10 == 5) {
            local_250 = *(ulong *)(uVar11 & 0xfffffffffffffff8);
            uVar11 = (local_250 & 0x7f00000000000000) + 0xff00000000000000;
            if ((byte)(uVar11 >> 0x38) < 8) {
              (*(code *)(&DAT_0025f418 + *(int *)(&DAT_0025f418 + (uVar11 >> 0x38) * 4)))();
              return;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"<unknown ",9);
            (anonymous_namespace)::uint64_to_hex_abi_cxx11_(in_stack_fffffffffffffd60);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1a8,(char *)CONCAT71(uStackY_2b7,local_2b8),
                                local_2b0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,">",1);
            if ((undefined8 *)CONCAT71(uStackY_2b7,local_2b8) != &local_2a8) {
              operator_delete((undefined8 *)CONCAT71(uStackY_2b7,local_2b8),local_2a8 + 1);
            }
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2b8);
          }
          else if (uVar11 == 7) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#f",2);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2b8);
          }
          else if (uVar11 == 0x1f) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"()",2);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2b8);
          }
          else if (uVar11 == 0xf) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#t",2);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_268,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2b8);
          }
          else {
            cVar7 = (char)(uVar11 >> 8);
            if ((uVar11 & 0xff) == 0x17) {
              uVar10 = (uint)(uVar11 >> 8) & 0xff;
              if (uVar10 - 0x20 < 0x5f) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#\\",2);
                local_2b8 = cVar7;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,&local_2b8,1);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#\\",2);
                *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
                     *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xfffffefb | 4;
                lVar4 = *(long *)(local_1a8 + -0x18);
                if (acStack_c8[lVar4 + 1] == '\0') {
                  cVar7 = std::ios::widen((char)lVar4 + (char)(ostream *)&local_1a8);
                  acStack_c8[lVar4] = cVar7;
                  acStack_c8[lVar4 + 1] = '\x01';
                }
                acStack_c8[lVar4] = '0';
                *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18) + 8) = 3;
                plVar9 = (long *)std::ostream::operator<<((ostream *)&local_1a8,uVar10);
                puVar2 = (uint *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x18);
                *puVar2 = *puVar2 & 0xfffffefb;
              }
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_268,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2b8);
            }
            else {
              if (uVar11 == 0x4f) goto LAB_00249d3e;
              if (uVar11 == 0x47) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#eof",4);
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
              else if (uVar11 == 0x27) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"#undefined",10);
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
              else if (uVar10 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"<procedure>",0xb);
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
              else if (uVar11 == 0x3f) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"compiler error, to check: ",0x1a);
                if (local_248 != (context *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": ",2);
                  local_1e0.
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (local_230->
                            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
                  local_1e0.
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       (local_230->
                       super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_refcount._M_pi;
                  if (local_1e0.
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_1e0.
                       super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_1e0.
                            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_1e0.
                       super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_1e0.
                            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  print_last_global_variable_used
                            ((ostream *)&local_1a8,&local_1e0,local_228,local_248);
                  if (local_1e0.
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_1e0.
                               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
              else if (uVar11 == 0x57) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"unknown variable",0x10);
                if (local_248 != (context *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": ",2);
                  local_1d0.
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (local_230->
                            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr;
                  local_1d0.
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       (local_230->
                       super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_refcount._M_pi;
                  if (local_1d0.
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_1d0.
                       super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_1d0.
                            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_1d0.
                       super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_1d0.
                            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  print_last_global_variable_used
                            ((ostream *)&local_1a8,&local_1d0,local_228,local_248);
                  if (local_1d0.
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_1d0.
                               super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
              else if ((int)(uVar11 & 0xff) == 0x2f) {
                if ((uVar11 & 0xff00) == 0) {
                  std::__cxx11::stringstream::~stringstream(local_1b8);
                  std::ios_base::~ios_base(local_138);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_0024ae31;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"runtime error: ",0xf);
                uVar11 = (ulong)(byte)(cVar7 + 0x80);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,
                           &DAT_0025f438 + *(int *)(&DAT_0025f438 + uVar11 * 4),
                           *(long *)(&DAT_0025f838 + uVar11 * 8));
                if (local_248 != (context *)0x0) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": ",2);
                }
                local_1f0.
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (local_230->
                          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr;
                local_1f0.
                super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (local_230->
                     super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount._M_pi;
                if (local_1f0.
                    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_1f0.
                     super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_1f0.
                          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_1f0.
                     super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (local_1f0.
                          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                print_last_global_variable_used
                          ((ostream *)&local_1a8,&local_1f0,local_228,local_248);
                if (local_1f0.
                    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_1f0.
                             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"<unknown ",9);
                (anonymous_namespace)::uint64_to_hex_abi_cxx11_(in_stack_fffffffffffffd60);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&local_1a8,(char *)CONCAT71(uStackY_2b7,local_2b8),
                                    local_2b0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,">",1);
                if ((undefined8 *)CONCAT71(uStackY_2b7,local_2b8) != &local_2a8) {
                  operator_delete((undefined8 *)CONCAT71(uStackY_2b7,local_2b8),local_2a8 + 1);
                }
                std::__cxx11::stringbuf::str();
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
              }
            }
          }
        }
        if ((undefined8 *)CONCAT71(uStackY_2b7,local_2b8) != &local_2a8) {
          operator_delete((undefined8 *)CONCAT71(uStackY_2b7,local_2b8),local_2a8 + 1);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_268,&local_218);
      }
LAB_00249d3e:
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      pbVar12 = local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (local_288.
             super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_288.
             super__Vector_base<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  for (; pbVar12 != pbVar5; pbVar12 = pbVar12 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1f8,(pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
  }
LAB_0024ae31:
  std::
  vector<skiwi::(anonymous_namespace)::task,_std::allocator<skiwi::(anonymous_namespace)::task>_>::
  ~vector(&local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  return;
}

Assistant:

void print_ptr(uint64_t rax2, std::ostream& out, std::shared_ptr<SKIWI::environment<SKIWI::environment_entry>> env, const repl_data& rd, const context* p_ctxt)
    {
    std::vector<std::string> texts;
    std::vector<task> todo;
    todo.emplace_back(rax2);

    while (!todo.empty())
      {
      uint64_t rax = todo.back().rax;
      int second_item_of_pair = todo.back().second_item_of_pair;
      std::string txt = todo.back().txt;
      todo.pop_back();
      std::stringstream str;
      str << std::setprecision(out.precision());
      if (!txt.empty())
        {
        texts.push_back(txt);
        }
      else if ((rax & fixnum_mask) == fixnum_tag)
        {
        int64_t value = (int64_t)(((int64_t)rax) >> (int64_t)fixnum_shift);
        str << value;
        texts.push_back(str.str());
        }
      else if ((rax & block_mask) == block_tag)
        {
        uint64_t* addr = get_address_from_block(rax);
        uint64_t header = *addr;
        if (block_header_is_flonum(header))
          {
          assert(get_block_size(header) == 1);
          double* d = reinterpret_cast<double*>((uint64_t*)(addr + 1));
          str << std::defaultfloat << *d;
          texts.push_back(str.str());
          }
        else if (block_header_is_closure(header))
          {
          str << "<lambda>";
          texts.push_back(str.str());
          }
        else if (block_header_is_pair(header))
          {
          //In general, the rule for printing a pair is as follows : use the dot notation always,
          //but if the dot is immediately followed by an open parenthesis, then remove the dot, the
          //open parenthesis, and the matching close parenthesis.Thus, (0 . (1 . 2)) becomes
          //(0 1 . 2), and (1 . (2 . (3 . ()))) becomes (1 2 3).
          assert(get_block_size(header) == 2);
          uint64_t first = *((uint64_t*)(addr + 1));
          uint64_t second = *((uint64_t*)(addr + 2));
          if (!second_item_of_pair)
            {
            str << "(";
            texts.push_back(str.str());
            }
          size_t idx0 = todo.size();
          todo.emplace_back(first, 0);
          if (second == nil)
            {
            }
          else
            {
            if (!is_pair(second))
              todo.emplace_back(" . ");
            else
              todo.emplace_back(" ");
            todo.emplace_back(second, 1);
            }
          if (!second_item_of_pair)
            todo.emplace_back(")");
          std::reverse(todo.begin() + idx0, todo.end());
          }
        else if (block_header_is_vector(header))
          {
          str << "#(";
          texts.push_back(str.str());
          size_t idx0 = todo.size();
          for (int i = 0; i < get_block_size(header); ++i)
            {
            if (i)
              todo.emplace_back(" ");
            uint64_t item = *((uint64_t*)(addr + i + 1));
            todo.emplace_back(item, 0);
            }
          todo.emplace_back(")");
          std::reverse(todo.begin() + idx0, todo.end());
          }
        else if (block_header_is_string(header))
          {
          str << "\"";
          char* ch = (char*)(addr + 1);
          str << ch;
          str << "\"";
          texts.push_back(str.str());
          }
        else if (block_header_is_symbol(header))
          {
          char* ch = (char*)(addr + 1);
          str << ch;
          texts.push_back(str.str());
          }
        else if (block_header_is_port(header))
          {
          uint64_t name_address = *((uint64_t*)(addr + 1 + 1));
          str << "<port>: ";
          texts.push_back(str.str());
          todo.emplace_back(name_address, second_item_of_pair);
          }
        else if (block_header_is_promise(header))
          {
          str << "<promise>";
          texts.push_back(str.str());
          }
        else
          {
          str << "<unknown " << uint64_to_hex(rax) << ">";
          texts.push_back(str.str());
          }
        }
      else if (rax == bool_t)
        {
        str << "#t";
        texts.push_back(str.str());
        }
      else if (rax == bool_f)
        {
        str << "#f";
        texts.push_back(str.str());
        }
      else if (rax == nil)
        {
        str << "()";
        texts.push_back(str.str());
        }
      else if ((rax & char_mask) == char_tag)
        {
        unsigned char ch = (unsigned char)(rax >> 8);
        if (ch > 31 && ch < 127)
          str << "#\\" << ch;
        else
          str << "#\\" << std::fixed << std::setfill('0') << std::setw(3) << int(ch) << std::defaultfloat;
        texts.push_back(str.str());
        }
      else if (rax == skiwi_undefined)
        {
        str << "#undefined";
        texts.push_back(str.str());
        }
      else if (rax == skiwi_quiet_undefined)
        {
        }
      else if (rax == eof_tag)
        {
        str << "#eof";
        texts.push_back(str.str());
        }
      else if ((rax & procedure_mask) == procedure_tag)
        {
        str << "<procedure>";
        texts.push_back(str.str());
        }
      else if (rax == unresolved_tag)
        {
        str << "unknown variable";
        if (p_ctxt)
          {
          str << ": ";
          print_last_global_variable_used(str, env, rd, p_ctxt);
          }
        texts.push_back(str.str());
        }
      else if (rax == unalloc_tag)
        {
        str << "compiler error, to check: ";
        if (p_ctxt)
          {
          str << ": ";
          print_last_global_variable_used(str, env, rd, p_ctxt);
          }
        texts.push_back(str.str());
        }
      else if ((rax & error_mask) == error_tag)
        {
        uint64_t error_id = (rax >> 8) & ((1 << 8) - 1);
        //uint64_t original_rax_lowest_48 = (rax >> 16);
        runtime_error re = (runtime_error)error_id;
        if (re == re_silent)
          return;
        str << "runtime error: ";
        switch (re)
          {
          case re_lambda_invalid_number_of_arguments: str << "<lambda>: invalid number of arguments"; break;
          case re_add_contract_violation: str << "+: contract violation"; break;
          case re_add1_contract_violation: str << "add1: contract violation"; break;
          case re_div_contract_violation: str << "/: contract violation"; break;
          case re_mul_contract_violation: str << "*: contract violation"; break;
          case re_equal_contract_violation: str << "=: contract violation"; break;
          case re_not_equal_contract_violation: str << "!=: contract violation"; break;
          case re_less_contract_violation: str << "<: contract violation"; break;
          case re_leq_contract_violation: str << "<=: contract violation"; break;
          case re_greater_contract_violation: str << ">: contract violation"; break;
          case re_geq_contract_violation: str << ">=: contract violation"; break;
          case re_sub_contract_violation: str << "-: contract violation"; break;
          case re_sub1_contract_violation: str << "sub1: contract violation"; break;
          case re_invalid_program_termination: str << "invalid program termination"; break;
          case re_closure_expected: str << "closure expected"; break;
          case re_vector_ref_contract_violation: str << "vector-ref: contract violation"; break;
          case re_vector_ref_out_of_bounds: str << "vector-ref: out of bounds"; break;
          case re_vector_set_contract_violation: str << "vector-set!: contract violation"; break;
          case re_vector_set_out_of_bounds: str << "vector-set!: out of bounds"; break;
          case re_closure_ref_contract_violation: str << "closure-ref: contract violation"; break;
          case re_closure_ref_out_of_bounds: str << "closure-ref: out of bounds"; break;
          case re_is_zero_contract_violation: str << "zero?: contract violation"; break;
          case re_cons_contract_violation: str << "cons: contract violation"; break;
          case re_car_contract_violation: str << "car: contract violation"; break;
          case re_cdr_contract_violation: str << "cdr: contract violation"; break;
          case re_vector_contract_violation: str << "vector: contract violation"; break;
          case re_make_vector_contract_violation: str << "make-vector: contract violation"; break;
          case re_vector_length_contract_violation: str << "vector-length: contract violation"; break;
          case re_string_contract_violation: str << "vector-length: contract violation"; break;
          case re_make_string_contract_violation: str << "make-string: contract violation"; break;
          case re_string_length_contract_violation: str << "string-length: contract violation"; break;
          case re_string_ref_contract_violation: str << "string-ref: contract violation"; break;
          case re_string_ref_out_of_bounds: str << "string-ref: out of bounds"; break;
          case re_string_set_contract_violation: str << "string-set!: contract violation"; break;
          case re_string_set_out_of_bounds: str << "string-set!: out of bounds"; break;
          case re_eq_contract_violation: str << "eq?: contract violation"; break;
          case re_eqv_contract_violation: str << "eqv?: contract violation"; break;
          case re_eqvstruct_contract_violation: str << "%eqv?: contract violation"; break;
          case re_isequal_contract_violation: str << "equal?: contract violation"; break;
          case re_length_contract_violation: str << "length: contract violation"; break;
          case re_set_car_contract_violation: str << "set-car!: contract violation"; break;
          case re_set_cdr_contract_violation: str << "set-cdr!: contract violation"; break;
          case re_fixnum_to_char_contract_violation: str << "fixnum->char: contract violation"; break;
          case re_char_to_fixnum_contract_violation: str << "char->fixnum: contract violation"; break;
          case re_char_equal_contract_violation: str << "char=?: contract violation"; break;
          case re_char_less_contract_violation: str << "char<?: contract violation"; break;
          case re_char_greater_contract_violation: str << "char>?: contract violation"; break;
          case re_char_leq_contract_violation: str << "char<=?: contract violation"; break;
          case re_char_geq_contract_violation: str << "char>=?: contract violation"; break;
          case re_fx_equal_contract_violation: str << "fx=?: contract violation"; break;
          case re_fx_less_contract_violation: str << "fx<?: contract violation"; break;
          case re_fx_greater_contract_violation: str << "fx>?: contract violation"; break;
          case re_fx_leq_contract_violation: str << "fx<=?: contract violation"; break;
          case re_fx_geq_contract_violation: str << "fx>=?: contract violation"; break;
          case re_fx_add_contract_violation: str << "fx+: contract violation"; break;
          case re_fx_sub_contract_violation: str << "fx-: contract violation"; break;
          case re_fx_mul_contract_violation: str << "fx*: contract violation"; break;
          case re_fx_div_contract_violation: str << "fx/: contract violation"; break;
          case re_fx_add1_contract_violation: str << "fxadd1: contract violation"; break;
          case re_fx_sub1_contract_violation: str << "fxsub1: contract violation"; break;
          case re_fx_is_zero_contract_violation: str << "fxzero?: contract violation"; break;
          case re_bitwise_and_contract_violation:str << "bitwise-and: contract violation"; break;
          case re_bitwise_not_contract_violation:str << "bitwise-not: contract violation"; break;
          case re_bitwise_or_contract_violation:str << "bitwise-or: contract violation"; break;
          case re_bitwise_xor_contract_violation:str << "bitwise-xor: contract violation"; break;
          case re_make_vector_heap_overflow: str << "make-vector: heap overflow"; break;
          case re_closure_heap_overflow: str << "closure: heap overflow"; break;
          case re_vector_heap_overflow: str << "vector: heap overflow"; break;
          case re_make_string_heap_overflow: str << "make-string: heap overflow"; break;
          case re_string_heap_overflow: str << "string: heap overflow"; break;
          case re_list_heap_overflow: str << "list: heap overflow"; break;
          case re_cons_heap_overflow: str << "cons: heap overflow"; break;
          case re_symbol_heap_overflow: str << "symbol: heap overflow"; break;
          case re_flonum_heap_overflow: str << "flonum: heap overflow"; break;
          case re_foreign_call_contract_violation: str << "foreign-call: contract violation"; break;
          case re_memv_contract_violation: str << "memv: contract violation"; break;
          case re_memq_contract_violation: str << "memq: contract violation"; break;
          case re_member_contract_violation: str << "member: contract violation"; break;
          case re_assv_contract_violation: str << "assv: contract violation"; break;
          case re_assq_contract_violation: str << "assq: contract violation"; break;
          case re_assoc_contract_violation: str << "assoc: contract violation"; break;
          case re_apply_contract_violation: str << "apply: contract violation"; break;
          case re_make_port_contract_violation: str << "make-port: contract violation"; break;
          case re_make_port_heap_overflow: str << "make-port: heap overflow"; break;
          case re_write_char_contract_violation: str << "write-char: contract violation"; break;
          case re_flush_output_port_contract_violation: str << "flush-output-port: contract violation"; break;
          case re_ieee754_sign_contract_violation: str << "ieee754-sign: contract violation"; break;
          case re_ieee754_exponent_contract_violation: str << "ieee754-exponent: contract violation"; break;
          case re_ieee754_mantissa_contract_violation: str << "ieee754-mantissa: contract violation"; break;
          case re_max_contract_violation: str << "max: contract violation"; break;
          case re_min_contract_violation: str << "min: contract violation"; break;
          case re_arithmetic_shift_contract_violation: str << "arithmetic-shift: contract violation"; break;
          case re_quotient_contract_violation: str << "quotient: contract violation"; break;
          case re_remainder_contract_violation: str << "remainder: contract violation"; break;
          case re_fixnum_to_flonum_contract_violation: str << "fixnum->flonum: contract violation"; break;
          case re_flonum_to_fixnum_contract_violation: str << "flonum->fixnum: contract violation"; break;
          case re_fixnum_to_flonum_heap_overflow: str << "fixnum->flonum: heap overflow"; break;
          case re_ieee754_sin_contract_violation: str << "ieee754-sin: contract violation"; break;
          case re_ieee754_cos_contract_violation: str << "ieee754-cos: contract violation"; break;
          case re_ieee754_tan_contract_violation: str << "ieee754-tan: contract violation"; break;
          case re_ieee754_asin_contract_violation: str << "ieee754-asin: contract violation"; break;
          case re_ieee754_acos_contract_violation: str << "ieee754-acos: contract violation"; break;
          case re_ieee754_atan1_contract_violation: str << "ieee754-atan1: contract violation"; break;
          case re_ieee754_log_contract_violation: str << "ieee754-log: contract violation"; break;
          case re_ieee754_round_contract_violation: str << "ieee754-round: contract violation"; break;
          case re_ieee754_truncate_contract_violation: str << "ieee754-truncate: contract violation"; break;
          case re_ieee754_sqrt_contract_violation: str << "ieee754-sqrt: contract violation"; break;
          case re_ieee754_pi_contract_violation: str << "ieee754-pi contract violation"; break;
          case re_fixnum_expt_contract_violation: str << "fixnum-expt: contract violation"; break;
          case re_flonum_expt_contract_violation: str << "flonum-expt: contract violation"; break;
          case re_is_port_contract_violation: str << "port?: contract violation"; break;
          case re_is_input_port_contract_violation: str << "input-port?: contract violation"; break;
          case re_is_output_port_contract_violation: str << "output-port?: contract violation"; break;
          case re_open_file_contract_violation: str << "open-file: contract violation"; break;
          case re_close_file_contract_violation: str << "close-file: contract violation"; break;
          case re_port_ref_contract_violation: str << "port-ref: contract violation"; break;
          case re_port_ref_out_of_bounds: str << "port-ref: out of bounds"; break;
          case re_read_char_contract_violation: str << "read-char: contract violation"; break;
          case re_peek_char_contract_violation: str << "peek-char: contract violation"; break;
          case re_num2str_contract_violation: str << "num2str: contract violation"; break;
          case re_str2num_contract_violation: str << "str2num: contract violation"; break;
          case re_write_string_contract_violation: str << "write-string: contract violation"; break;
          case re_string_copy_contract_violation: str << "string-copy: contract violation"; break;
          case re_symbol_to_string_contract_violation: str << "symbol->string: contract violation"; break;
          case re_string_copy_heap_overflow: str << "string-copy: heap overflow"; break;
          case re_symbol_to_string_heap_overflow: str << "symbol->string: heap overflow"; break;
          case re_compare_strings_contract_violation: str << "compare-strings: contract violation"; break;
          case re_compare_strings_ci_contract_violation: str << "compare-strings-ci: contract violation"; break;
          case re_vector_fill_contract_violation: str << "vector-fill!: contract violation"; break;
          case re_string_fill_contract_violation: str << "string-fill!: contract violation"; break;
          case re_substring_contract_violation: str << "substring: contract violation"; break;
          case re_substring_heap_overflow: str << "substring: heap overflow"; break;
          case re_substring_out_of_bounds: str << "substring: out of bounds"; break;
          case re_string_append_contract_violation: str << "string-append: contract violation"; break;
          case re_string_append_heap_overflow: str << "string-append: heap overflow"; break;
          case re_string_hash_contract_violation: str << "string-hash: contract violation"; break;
          case re_allocate_symbol_contract_violation: str << "%allocate-symbol: contract violation"; break;
          case re_allocate_symbol_heap_overflow: str << "%allocate-symbol: heap overflow"; break;
          case re_make_promise_contract_violation: str << "make-promise: contract violation"; break;
          case re_make_promise_heap_overflow: str << "make-promise: heap overflow"; break;
          case re_slot_ref_out_of_bounds:str << "%slot-ref: out of bounds"; break;
          case re_slot_ref_contract_violation: str << "%slot-ref: contract violation"; break;
          case re_slot_set_out_of_bounds:str << "%slot-set!: out of bounds"; break;
          case re_slot_set_contract_violation: str << "%slot-set!: contract violation"; break;
          case re_division_by_zero: str << "division by zero"; break;
          case re_heap_full: str << "heap is full"; break;
          case re_load_contract_violation: str << "load: contract violation"; break;
          case re_eval_contract_violation: str << "%eval: contract violation"; break;
          case re_getenv_contract_violation: str << "getenv: contract violation"; break;
          case re_getenv_heap_overflow: str << "getenv: heap overflow"; break;
          case re_putenv_contract_violation: str << "putenv: contract violation"; break;
          case re_file_exists_contract_violation: str << "file-exists?: contract violation"; break;
          default: str << "unknown error"; break;
          }
        if (p_ctxt)
          str << ": ";
        print_last_global_variable_used(str, env, rd, p_ctxt);
        //str << "\nInstead I got ";
        texts.push_back(str.str());
        //todo.emplace_back(original_rax_lowest_48, 0);        
        }
      else
        {
        str << "<unknown " << uint64_to_hex(rax) << ">";
        texts.push_back(str.str());
        }
      }
    for (const auto& s : texts)
      out << s;
    }